

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereIndexExprTransColumn(Walker *p,Expr *pExpr)

{
  short sVar1;
  IdxExprTrans *pTrans;
  char cVar2;
  
  if (((pExpr->op == 0xa7) && (pTrans = (p->u).pIdxTrans, pExpr->iTable == pTrans->iTabCur)) &&
     (pTrans->iTabCol == (int)pExpr->iColumn)) {
    preserveExpr(pTrans,pExpr);
    sVar1 = pExpr->iColumn;
    cVar2 = 'D';
    if ((-1 < (long)sVar1) && (sVar1 < ((pExpr->y).pTab)->nCol)) {
      cVar2 = ((pExpr->y).pTab)->aCol[sVar1].affinity;
    }
    pExpr->affExpr = cVar2;
    pExpr->iTable = pTrans->iIdxCur;
    pExpr->iColumn = (ynVar)pTrans->iIdxCol;
    (pExpr->y).pTab = (Table *)0x0;
  }
  return 0;
}

Assistant:

static int whereIndexExprTransColumn(Walker *p, Expr *pExpr){
  if( pExpr->op==TK_COLUMN ){
    IdxExprTrans *pX = p->u.pIdxTrans;
    if( pExpr->iTable==pX->iTabCur && pExpr->iColumn==pX->iTabCol ){
      assert( ExprUseYTab(pExpr) && pExpr->y.pTab!=0 );
      preserveExpr(pX, pExpr);
      pExpr->affExpr = sqlite3TableColumnAffinity(pExpr->y.pTab,pExpr->iColumn);
      pExpr->iTable = pX->iIdxCur;
      pExpr->iColumn = pX->iIdxCol;
      pExpr->y.pTab = 0;
    }
  }
  return WRC_Continue;
}